

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

err_t rngESHealth(void)

{
  err_t eVar1;
  size_t pos;
  size_t valid_sources;
  char *sources [3];
  char *in_stack_00000998;
  ulong local_38;
  long local_30;
  err_t local_4;
  
  local_30 = 0;
  eVar1 = rngESHealth2();
  if (eVar1 == 0) {
    local_4 = 0;
  }
  else {
    for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
      eVar1 = rngESTest(in_stack_00000998);
      if ((eVar1 == 0) && (local_30 = local_30 + 1, local_30 == 2)) {
        return 0;
      }
    }
    if (local_30 == 1) {
      local_4 = 0x12f;
    }
    else {
      local_4 = 0x12e;
    }
  }
  return local_4;
}

Assistant:

err_t rngESHealth()
{
	const char* sources[] = { "sys", "sys2", "timer" };
	size_t valid_sources = 0;
	size_t pos;
	// есть работоспособный физический источник?
	if (rngESHealth2() == ERR_OK)
		return ERR_OK;
	// проверить остальные источники
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
	{
		if (rngESTest(sources[pos]) != ERR_OK)
			continue;
		// два работоспособных источника?
		if (++valid_sources == 2)
			return ERR_OK;
	}
	// только один?
	if (valid_sources == 1)
		return ERR_NOT_ENOUGH_ENTROPY;
	// ни одного
	return ERR_BAD_ENTROPY;
}